

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O0

void __thiscall
iqnet::Reactor<boost::mutex>::register_handler
          (Reactor<boost::mutex> *this,Event_handler *eh,Event_mask mask)

{
  undefined4 uVar1;
  bool bVar2;
  uint uVar3;
  mapped_type *ppEVar4;
  pointer pHVar5;
  _List_iterator<iqnet::Reactor_base::HandlerState> local_60;
  hs_iterator i;
  _Self local_50;
  _Self local_48;
  int local_40 [2];
  Handler fd;
  undefined1 local_30 [8];
  scoped_lock lk;
  Event_mask mask_local;
  Event_handler *eh_local;
  Reactor<boost::mutex> *this_local;
  
  lk._12_4_ = mask;
  boost::unique_lock<boost::mutex>::unique_lock((unique_lock<boost::mutex> *)local_30,&this->lock);
  uVar3 = (*eh->_vptr_Event_handler[2])();
  if ((uVar3 & 1) != 0) {
    this->num_stoppers = this->num_stoppers + 1;
  }
  local_40[0] = (*eh->_vptr_Event_handler[9])();
  local_48._M_node =
       (_Base_ptr)
       std::
       map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
       ::find(&this->handlers,local_40);
  local_50._M_node =
       (_Base_ptr)
       std::
       map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
       ::end(&this->handlers);
  bVar2 = std::operator==(&local_48,&local_50);
  if (bVar2) {
    Reactor_base::HandlerState::HandlerState((HandlerState *)&i,local_40[0],lk._12_4_);
    std::__cxx11::
    list<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>::
    push_back(&this->handlers_states,(value_type *)&i);
    ppEVar4 = std::
              map<int,_iqnet::Event_handler_*,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
              ::operator[](&this->handlers,local_40);
    *ppEVar4 = eh;
  }
  else {
    local_60._M_node = (_List_node_base *)find_handler_state(this,eh);
    uVar1 = lk._12_4_;
    pHVar5 = std::_List_iterator<iqnet::Reactor_base::HandlerState>::operator->(&local_60);
    pHVar5->mask = pHVar5->mask | (ushort)uVar1;
  }
  boost::unique_lock<boost::mutex>::~unique_lock((unique_lock<boost::mutex> *)local_30);
  return;
}

Assistant:

void Reactor<Lock>::register_handler( Event_handler* eh, Event_mask mask )
{
  scoped_lock lk(lock);

  if (eh->is_stopper())
    num_stoppers++;

  Socket::Handler fd = eh->get_handler();

  if( handlers.find(fd) == handlers.end() )
  {
    handlers_states.push_back( HandlerState(fd, mask) );
    handlers[fd] = eh;
  }
  else
  {
    typename Reactor<Lock>::hs_iterator i = find_handler_state(eh);
    i->mask |= mask;
  }
}